

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_d16_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  int w_00;
  char in_SIL;
  int shift;
  int in_stack_000009a0;
  int in_stack_000009a4;
  CONV_BUF_TYPE *in_stack_000009a8;
  int in_stack_000009b4;
  CONV_BUF_TYPE *in_stack_000009b8;
  uint8_t *in_stack_000009c0;
  int in_stack_ffffffffffffffc8;
  
  w_00 = (-*(int *)(CONCAT44(src1_stride,shift) + 0x18) -
         *(int *)(CONCAT44(src1_stride,shift) + 0x14)) + (int)src1 + 6;
  if (in_SIL == '\0') {
    build_compound_diffwtd_mask_d16_avx2
              (in_stack_000009c0,in_stack_000009b8,in_stack_000009b4,in_stack_000009a8,
               in_stack_000009a4,in_stack_000009a0,w_00,in_stack_ffffffffffffffc8);
  }
  else {
    build_compound_diffwtd_mask_d16_inv_avx2
              (in_stack_000009c0,in_stack_000009b8,in_stack_000009b4,in_stack_000009a8,
               in_stack_000009a4,in_stack_000009a0,w_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_avx2(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  const int shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  // When rounding constant is added, there is a possibility of overflow.
  // However that much precision is not required. Code should very well work for
  // other values of DIFF_FACTOR_LOG2 and AOM_BLEND_A64_MAX_ALPHA as well. But
  // there is a possibility of corner case bugs.
  assert(DIFF_FACTOR_LOG2 == 4);
  assert(AOM_BLEND_A64_MAX_ALPHA == 64);

  if (mask_type == DIFFWTD_38) {
    build_compound_diffwtd_mask_d16_avx2(mask, src0, src0_stride, src1,
                                         src1_stride, h, w, shift);
  } else {
    build_compound_diffwtd_mask_d16_inv_avx2(mask, src0, src0_stride, src1,
                                             src1_stride, h, w, shift);
  }
}